

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_init_multi(mp_int *mp,...)

{
  char in_AL;
  int iVar1;
  long lVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list clean_args;
  va_list args;
  mp_int *cur_arg;
  int n;
  mp_err res;
  mp_int *in_stack_fffffffffffffec8;
  mp_int *in_stack_fffffffffffffed0;
  long *local_120;
  mp_digit local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  uint local_58;
  undefined4 local_54;
  long *local_50;
  mp_digit *local_48;
  undefined1 local_38 [16];
  mp_digit *local_28;
  long local_18;
  int local_10;
  int local_c;
  long local_8;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_c = 0;
  local_10 = 0;
  local_28 = &local_108;
  local_38._8_8_ = &stack0x00000008;
  local_38._4_4_ = 0x30;
  local_38._0_4_ = 8;
  local_100 = in_RSI;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_18 = in_RDI;
  local_8 = in_RDI;
  while( true ) {
    if (local_18 == 0) {
      return local_c;
    }
    iVar1 = mp_init(in_stack_fffffffffffffec8);
    if (iVar1 != 0) break;
    local_10 = local_10 + 1;
    in_stack_fffffffffffffed0 = (mp_int *)local_38;
    if ((uint)local_38._0_4_ < 0x29) {
      lVar2 = (long)(int)local_38._0_4_;
      local_38._0_4_ = local_38._0_4_ + 8;
      in_stack_fffffffffffffec8 = (mp_int *)(lVar2 + (long)local_28);
    }
    else {
      in_stack_fffffffffffffec8 = (mp_int *)local_38._8_8_;
      local_38._8_8_ = (int *)(local_38._8_8_ + 8);
    }
    local_18._0_4_ = in_stack_fffffffffffffec8->used;
    local_18._4_4_ = in_stack_fffffffffffffec8->alloc;
  }
  local_18 = local_8;
  local_48 = &local_108;
  local_50 = (long *)&stack0x00000008;
  local_54 = 0x30;
  local_58 = 8;
  while (local_10 != 0) {
    local_10 = local_10 + -1;
    mp_clear(in_stack_fffffffffffffed0);
    if (local_58 < 0x29) {
      local_120 = (long *)((long)local_48 + (long)(int)local_58);
      local_58 = local_58 + 8;
    }
    else {
      local_120 = local_50;
      local_50 = local_50 + 1;
    }
    local_18 = *local_120;
  }
  return -2;
}

Assistant:

int mp_init_multi(mp_int *mp, ...) 
{
    mp_err res = MP_OKAY;      /* Assume ok until proven otherwise */
    int n = 0;                 /* Number of ok inits */
    mp_int* cur_arg = mp;
    va_list args;

    va_start(args, mp);        /* init args to next argument from caller */
    while (cur_arg != NULL) {
        if (mp_init(cur_arg) != MP_OKAY) {
            /* Oops - error! Back-track and mp_clear what we already
               succeeded in init-ing, then return error.
            */
            va_list clean_args;
            
            /* end the current list */
            va_end(args);
            
            /* now start cleaning up */            
            cur_arg = mp;
            va_start(clean_args, mp);
            while (n--) {
                mp_clear(cur_arg);
                cur_arg = va_arg(clean_args, mp_int*);
            }
            va_end(clean_args);
            res = MP_MEM;
            break;
        }
        n++;
        cur_arg = va_arg(args, mp_int*);
    }
    va_end(args);
    return res;                /* Assumed ok, if error flagged above. */
}